

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  uint uVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  
  uVar14 = bottom_top_blob->c;
  uVar10 = (ulong)uVar14;
  uVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar14) {
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      uVar12 = 0;
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18._16_4_ = 0x3f800000;
      auVar18._20_4_ = 0x3f800000;
      auVar18._24_4_ = 0x3f800000;
      auVar18._28_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar9) {
          pauVar15 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar9;
          do {
            fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            fVar22 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            auVar24._0_4_ = fVar22 * *(float *)*pauVar15 + fVar1;
            auVar24._4_4_ = fVar22 * *(float *)(*pauVar15 + 4) + fVar1;
            auVar24._8_4_ = fVar22 * *(float *)(*pauVar15 + 8) + fVar1;
            auVar24._12_4_ = fVar22 * *(float *)(*pauVar15 + 0xc) + fVar1;
            auVar24._16_4_ = fVar22 * *(float *)(*pauVar15 + 0x10) + fVar1;
            auVar24._20_4_ = fVar22 * *(float *)(*pauVar15 + 0x14) + fVar1;
            auVar24._24_4_ = fVar22 * *(float *)(*pauVar15 + 0x18) + fVar1;
            auVar24._28_4_ = fVar22 + fVar1;
            auVar24 = vmaxps_avx(auVar24,ZEXT832(0));
            auVar24 = vminps_avx(auVar24,auVar18);
            auVar4._4_4_ = auVar24._4_4_ * *(float *)(*pauVar15 + 4);
            auVar4._0_4_ = auVar24._0_4_ * *(float *)*pauVar15;
            auVar4._8_4_ = auVar24._8_4_ * *(float *)(*pauVar15 + 8);
            auVar4._12_4_ = auVar24._12_4_ * *(float *)(*pauVar15 + 0xc);
            auVar4._16_4_ = auVar24._16_4_ * *(float *)(*pauVar15 + 0x10);
            auVar4._20_4_ = auVar24._20_4_ * *(float *)(*pauVar15 + 0x14);
            auVar4._24_4_ = auVar24._24_4_ * *(float *)(*pauVar15 + 0x18);
            auVar4._28_4_ = *(undefined4 *)(*pauVar15 + 0x1c);
            *pauVar15 = auVar4;
            pauVar15 = pauVar15 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar14) {
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      uVar12 = 0;
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar9) {
          pauVar13 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar9;
          do {
            fVar6 = *(float *)((long)*pauVar13 + 4);
            fVar7 = *(float *)((long)*pauVar13 + 8);
            fVar8 = *(float *)((long)*pauVar13 + 0xc);
            fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            fVar22 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            auVar23._0_4_ = fVar22 * *(float *)*pauVar13 + fVar1;
            auVar23._4_4_ = fVar22 * fVar6 + fVar1;
            auVar23._8_4_ = fVar22 * fVar7 + fVar1;
            auVar23._12_4_ = fVar22 * fVar8 + fVar1;
            auVar23 = vmaxps_avx(auVar23,ZEXT816(0));
            auVar23 = vminps_avx(auVar23,auVar17);
            auVar20._0_4_ = auVar23._0_4_ * *(float *)*pauVar13;
            auVar20._4_4_ = auVar23._4_4_ * fVar6;
            auVar20._8_4_ = auVar23._8_4_ * fVar7;
            auVar20._12_4_ = auVar23._12_4_ * fVar8;
            *pauVar13 = auVar20;
            pauVar13 = pauVar13 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else if (0 < (int)uVar14) {
    pp_Var2 = this->_vptr_HardSwish_x86_avx;
    uVar12 = 0;
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar19._16_4_ = 0x3f800000;
    auVar19._20_4_ = 0x3f800000;
    auVar19._24_4_ = 0x3f800000;
    auVar19._28_4_ = 0x3f800000;
    do {
      pauVar15 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar14 = 0;
      }
      else {
        iVar16 = 7;
        do {
          p_Var3 = pp_Var2[-3];
          fVar1 = *(float *)(&this->field_0xd4 + (long)p_Var3);
          auVar18 = *pauVar15;
          fVar22 = *(float *)(&this->field_0xd0 + (long)p_Var3);
          auVar21._0_4_ = fVar22 * auVar18._0_4_ + fVar1;
          auVar21._4_4_ = fVar22 * auVar18._4_4_ + fVar1;
          auVar21._8_4_ = fVar22 * auVar18._8_4_ + fVar1;
          auVar21._12_4_ = fVar22 * auVar18._12_4_ + fVar1;
          auVar21._16_4_ = fVar22 * auVar18._16_4_ + fVar1;
          auVar21._20_4_ = fVar22 * auVar18._20_4_ + fVar1;
          auVar21._24_4_ = fVar22 * auVar18._24_4_ + fVar1;
          auVar21._28_4_ = fVar22 + fVar1;
          auVar24 = vmaxps_avx(auVar21,ZEXT832(0));
          auVar24 = vminps_avx(auVar24,auVar19);
          auVar5._4_4_ = auVar24._4_4_ * auVar18._4_4_;
          auVar5._0_4_ = auVar24._0_4_ * auVar18._0_4_;
          auVar5._8_4_ = auVar24._8_4_ * auVar18._8_4_;
          auVar5._12_4_ = auVar24._12_4_ * auVar18._12_4_;
          auVar5._16_4_ = auVar24._16_4_ * auVar18._16_4_;
          auVar5._20_4_ = auVar24._20_4_ * auVar18._20_4_;
          auVar5._24_4_ = auVar24._24_4_ * auVar18._24_4_;
          auVar5._28_4_ = auVar24._28_4_;
          *pauVar15 = auVar5;
          pauVar15 = pauVar15 + 1;
          iVar16 = iVar16 + 8;
          uVar14 = uVar9 & 0xfffffff8;
        } while (iVar16 < (int)uVar9);
      }
      if (uVar9 - uVar14 != 0 && (int)uVar14 <= (int)uVar9) {
        lVar11 = 0;
        do {
          fVar1 = *(float *)(*pauVar15 + lVar11 * 4);
          p_Var3 = pp_Var2[-3];
          fVar22 = 0.0;
          if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var3)) {
LAB_002facf1:
            *(float *)(*pauVar15 + lVar11 * 4) = fVar22;
          }
          else if (fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var3)) {
            fVar22 = (fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var3) +
                     *(float *)(&this->field_0xd4 + (long)p_Var3)) * fVar1;
            goto LAB_002facf1;
          }
          lVar11 = lVar11 + 1;
        } while (uVar9 - uVar14 != (int)lVar11);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}